

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_and_verify_uint64
               (uint64_t *res,uint64_t *first,uint64_t *second,uint64_t *r,view_t *view,
               uint64_t mask,uint viewshift)

{
  bool bVar1;
  ulong uVar2;
  uint64_t rsc;
  uint64_t tmp2;
  uint64_t tmp1;
  uint j;
  uint m;
  uint64_t mask_local;
  view_t *view_local;
  uint64_t *r_local;
  uint64_t *second_local;
  uint64_t *first_local;
  uint64_t *res_local;
  
  bVar1 = false;
  while (!bVar1) {
    uVar2 = (*second ^ second[1]) & *first ^ first[1] & *second ^ *r ^ r[1];
    *res = uVar2;
    if (viewshift == 0) {
      view->t[0] = uVar2;
    }
    else {
      view->t[0] = view->t[0] ^ uVar2 >> ((byte)viewshift & 0x3f);
    }
    bVar1 = true;
  }
  res[1] = view->t[1] << ((byte)viewshift & 0x3f) & mask;
  return;
}

Assistant:

static void mpc_and_verify_uint64(uint64_t* res, uint64_t const* first, uint64_t const* second,
                                  uint64_t const* r, view_t* view, uint64_t const mask,
                                  unsigned viewshift) {
  for (unsigned m = 0; m < (SC_VERIFY - 1); ++m) {
    const unsigned j = (m + 1);
    uint64_t tmp1    = second[m] ^ second[j];
    uint64_t tmp2    = first[j] & second[m];
    tmp1             = tmp1 & first[m];
    tmp1             = tmp1 ^ tmp2;
    tmp2             = r[m] ^ r[j];
    res[m] = tmp1 = tmp1 ^ tmp2;
    if (viewshift || m) {
      tmp1       = tmp1 >> viewshift;
      view->t[m] = view->t[m] ^ tmp1;
    } else {
      // on first call (viewshift == 0), view->t[0] == 0
      view->t[m] = tmp1;
    }
  }

  const uint64_t rsc = view->t[SC_VERIFY - 1] << viewshift;
  res[SC_VERIFY - 1] = rsc & mask;
}